

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QCommonArrayOps<QCss::Declaration>::growAppend
          (QCommonArrayOps<QCss::Declaration> *this,Declaration *b,Declaration *e)

{
  long lVar1;
  bool bVar2;
  QArrayDataPointer<QCss::Declaration> *old_00;
  Declaration *in_RDX;
  Declaration *in_RSI;
  QGenericArrayOps<QCss::Declaration> *in_RDI;
  long in_FS_OFFSET;
  qsizetype n;
  DataPointer old;
  QCommonArrayOps<QCss::Declaration> *c;
  GrowthPosition where;
  QArrayDataPointer<QCss::Declaration> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != in_RDX) {
    old_00 = (QArrayDataPointer<QCss::Declaration> *)((long)in_RDX - (long)in_RSI >> 3);
    c = (QCommonArrayOps<QCss::Declaration> *)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = (QArrayDataPointer<QCss::Declaration> *)&DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<QCss::Declaration>::QArrayDataPointer
              ((QArrayDataPointer<QCss::Declaration> *)&stack0xffffffffffffffd8);
    bVar2 = q_points_into_range<QtPrivate::QCommonArrayOps<QCss::Declaration>,QCss::Declaration_const*>
                      ((Declaration **)this_00,c);
    where = (GrowthPosition)((ulong)c >> 0x20);
    if (bVar2) {
      QArrayDataPointer<QCss::Declaration>::detachAndGrow
                (this_00,where,(qsizetype)in_RDI,(Declaration **)in_RDX,old_00);
    }
    else {
      QArrayDataPointer<QCss::Declaration>::detachAndGrow
                (this_00,where,(qsizetype)in_RDI,(Declaration **)in_RDX,old_00);
    }
    QGenericArrayOps<QCss::Declaration>::copyAppend(in_RDI,in_RDX,(Declaration *)old_00);
    QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer(old_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }